

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Acknowledge_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Acknowledge_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Acknowledge PDU-\n",0x12);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1e0,&this->super_Simulation_Management_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tAcknowledge Flag:  ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringAcknowledgeFlag_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)this->m_ui16AcknowledgeFlag,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tResponse Flag:     ",0x15);
  DATA_TYPE::ENUMS::GetEnumAsStringAcknowledgeResponseFlag_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)this->m_ui16ResponseFlag,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tRequest ID:        ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Acknowledge_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Acknowledge PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tAcknowledge Flag:  "   << GetEnumAsStringAcknowledgeFlag( m_ui16AcknowledgeFlag )
       << "\n\tResponse Flag:     " << GetEnumAsStringAcknowledgeResponseFlag( m_ui16ResponseFlag )
       << "\n\tRequest ID:        " << m_ui32RequestID
       << "\n";

    return ss.str();
}